

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vbo.cpp
# Opt level: O1

void __thiscall
vera::Vbo::load(Vbo *this,
               vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
               *_vertices)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer _vertices_00;
  VertexLayout *this_00;
  vector<vera::VertexAttrib,_std::allocator<vera::VertexAttrib>_> attribs;
  vector<vera::VertexAttrib,_std::allocator<vera::VertexAttrib>_> local_68;
  VertexAttrib local_50;
  
  local_68.super__Vector_base<vera::VertexAttrib,_std::allocator<vera::VertexAttrib>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.super__Vector_base<vera::VertexAttrib,_std::allocator<vera::VertexAttrib>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68.super__Vector_base<vera::VertexAttrib,_std::allocator<vera::VertexAttrib>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  paVar1 = &local_50.name.field_2;
  local_50.name._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"position","");
  local_50.size = 3;
  local_50.type = 0x1406;
  local_50.normalized = '\0';
  local_50.offset = (GLvoid *)0x0;
  std::vector<vera::VertexAttrib,_std::allocator<vera::VertexAttrib>_>::
  emplace_back<vera::VertexAttrib>(&local_68,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50.name._M_dataplus._M_p != paVar1) {
    operator_delete(local_50.name._M_dataplus._M_p);
  }
  this_00 = (VertexLayout *)operator_new(0x28);
  VertexLayout::VertexLayout(this_00,&local_68);
  if (this->m_vertexLayout != (VertexLayout *)0x0) {
    (*this->m_vertexLayout->_vptr_VertexLayout[1])();
  }
  this->m_vertexLayout = this_00;
  _vertices_00 = (_vertices->
                 super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
  addVertices(this,(GLbyte *)_vertices_00,
              (int)((ulong)((long)(_vertices->
                                  super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                                  )._M_impl.super__Vector_impl_data._M_finish - (long)_vertices_00)
                   >> 2) * -0x55555555);
  std::vector<vera::VertexAttrib,_std::allocator<vera::VertexAttrib>_>::~vector(&local_68);
  return;
}

Assistant:

void Vbo::load(const std::vector<glm::vec3> &_vertices) {
    std::vector<VertexAttrib> attribs;
    attribs.push_back({"position", 3, GL_FLOAT, false, 0});
    VertexLayout* vertexLayout = new VertexLayout(attribs);
    setVertexLayout( vertexLayout );

    addVertices((GLbyte*)_vertices.data(), _vertices.size());
}